

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

string * __thiscall
soul::CodeLocation::getFilename_abi_cxx11_(string *__return_storage_ptr__,CodeLocation *this)

{
  SourceCodeText *pSVar1;
  
  if ((this->sourceCode).object == (SourceCodeText *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pSVar1 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pSVar1->filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocation::getFilename() const
{
    if (sourceCode != nullptr)
        return sourceCode->filename;

    return {};
}